

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::reallocateTo
          (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *this,size_type newCapacity)

{
  pointer pEVar1;
  size_type sVar2;
  pointer pEVar3;
  long lVar4;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)newCapacity;
  pEVar3 = (pointer)operator_new(newCapacity * 8);
  pEVar1 = this->data_;
  sVar2 = this->len;
  for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    ctx = *(EVP_PKEY_CTX **)((long)&pEVar1->value + lVar4);
    *(EVP_PKEY_CTX **)((long)&pEVar3->value + lVar4) = ctx;
  }
  cleanup(this,ctx);
  this->cap = newCapacity;
  this->data_ = pEVar3;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }